

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int IFN_Down_Character(FORM *form)

{
  FIELD *field;
  _Bool _Var1;
  int iVar2;
  int iVar3;
  
  field = form->current;
  iVar2 = form->currow;
  form->currow = iVar2 + 1;
  iVar3 = 0;
  if (iVar2 + 1 == field->drows) {
    if ((int)field->rows + field->nrow != 1) {
      _Var1 = Field_Grown(field,1);
      if (_Var1) {
        return 0;
      }
      iVar2 = form->currow + -1;
    }
    form->currow = iVar2;
    iVar3 = -0xc;
  }
  return iVar3;
}

Assistant:

static int IFN_Down_Character(FORM * form)
{
  FIELD *field = form->current;

  if ( (++(form->currow)) == field->drows )
    {
#if GROW_IF_NAVIGATE
      if (!Single_Line_Field(field) && Field_Grown(field,1))
        return(E_OK);
#endif
      --(form->currow);
      return(E_REQUEST_DENIED);
    }
  return(E_OK);
}